

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string * __thiscall pbrt::ParsedParameter::ToString_abi_cxx11_(ParsedParameter *this)

{
  char __lhs;
  bool bVar1;
  const_iterator fmt;
  const_iterator puVar2;
  long in_RSI;
  char *pcVar3;
  string *in_RDI;
  bool b;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  double d;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *__range2;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_iterator local_1a8;
  string local_198 [32];
  string local_178 [32];
  const_iterator local_158;
  const_iterator local_150;
  const_iterator local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  string local_138 [32];
  double local_118;
  const_iterator local_110;
  const_iterator local_108;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *local_100;
  undefined1 local_f1 [56];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,
             (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             (allocator<char> *)in_stack_fffffffffffffe10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                 in_stack_fffffffffffffde0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                 (char *)in_stack_fffffffffffffde0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                 in_stack_fffffffffffffde0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             (allocator<char> *)in_stack_fffffffffffffe10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe10);
  std::__cxx11::string::operator+=((string *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  __lhs = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::empty
                    ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x49998b);
  if ((bool)__lhs) {
    bVar1 = pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x499bd2);
    if (bVar1) {
      bVar1 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                         0x499d3f);
      if (!bVar1) {
        local_1a8 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                    begin((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *
                          )(in_RSI + 0x98));
        puVar2 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::end
                           ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>
                             *)(in_RSI + 0x98));
        for (; local_1a8 != puVar2; local_1a8 = local_1a8 + 1) {
          pcVar3 = "false ";
          if (*local_1a8 != '\0') {
            pcVar3 = "true ";
          }
          std::__cxx11::string::operator+=((string *)in_RDI,pcVar3);
        }
      }
    }
    else {
      local_140 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RSI + 0x78);
      local_148 = pstd::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(local_140);
      local_150 = pstd::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(local_140);
      for (; local_148 != local_150; local_148 = local_148 + 1) {
        local_158 = local_148;
        std::operator+(__lhs,in_stack_fffffffffffffe10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                       (char *)in_stack_fffffffffffffde0);
        std::__cxx11::string::operator+=((string *)in_RDI,local_178);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_198);
      }
    }
  }
  else {
    local_100 = (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)(in_RSI + 0x58);
    local_108 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::begin(local_100);
    fmt = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::end(local_100);
    local_110 = fmt;
    for (; local_108 != local_110; local_108 = local_108 + 1) {
      local_118 = *local_108;
      StringPrintf<double&>
                ((char *)fmt,(double *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00)
                );
      std::__cxx11::string::operator+=((string *)in_RDI,local_138);
      std::__cxx11::string::~string(local_138);
    }
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"] ");
  return in_RDI;
}

Assistant:

std::string ParsedParameter::ToString() const {
    std::string str;
    str += std::string("\"") + type + " " + name + std::string("\" [ ");
    if (!numbers.empty())
        for (double d : numbers)
            str += StringPrintf("%f ", d);
    else if (!strings.empty())
        for (const auto &s : strings)
            str += '\"' + s + "\" ";
    else if (!bools.empty())
        for (bool b : bools)
            str += b ? "true " : "false ";
    str += "] ";

    return str;
}